

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointPolicyPureVector.h
# Opt level: O2

void __thiscall
JointPolicyPureVector::JointPolicyPureVector(JointPolicyPureVector *this,JointPolicyPureVector *a)

{
  JointPolicyDiscretePure::JointPolicyDiscretePure
            ((JointPolicyDiscretePure *)this,(JointPolicyDiscretePure *)a);
  JPolComponent_VectorImplementation::JPolComponent_VectorImplementation
            ((JPolComponent_VectorImplementation *)(this + 0x38),
             (JPolComponent_VectorImplementation *)(a + 0x38));
  *(undefined **)this = &JointPolicyDiscretePure::typeinfo;
  *(code **)(this + 0x38) = GMAA_MAAstarClassic::GMAA_MAAstarClassic;
  *(undefined8 *)(this + 0x90) = 0;
  *(undefined8 *)(this + 0x80) = 0;
  *(undefined8 *)(this + 0x88) = 0;
  return;
}

Assistant:

JointPolicyPureVector(const JointPolicyPureVector& a)
            :
            JointPolicyDiscretePure(a)
            , JPolComponent_VectorImplementation(a)
        {}